

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O3

bool __thiscall OpenMD::FragmentStamp::addNodesStamp(FragmentStamp *this,NodesStamp *nodes)

{
  pointer *pppNVar1;
  iterator __position;
  NodesStamp *local_8;
  
  __position._M_current =
       (this->nodesStamps_).
       super__Vector_base<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->nodesStamps_).
      super__Vector_base<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = nodes;
    std::vector<OpenMD::NodesStamp*,std::allocator<OpenMD::NodesStamp*>>::
    _M_realloc_insert<OpenMD::NodesStamp*const&>
              ((vector<OpenMD::NodesStamp*,std::allocator<OpenMD::NodesStamp*>> *)
               &this->nodesStamps_,__position,&local_8);
  }
  else {
    *__position._M_current = nodes;
    pppNVar1 = &(this->nodesStamps_).
                super__Vector_base<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return true;
}

Assistant:

bool FragmentStamp::addNodesStamp(NodesStamp* nodes) {
    nodesStamps_.push_back(nodes);
    return true;
  }